

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsGetScalarTypeFromName(char *name,FmsScalarType *type)

{
  int iVar1;
  undefined4 *in_RSI;
  char *in_RDI;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == (undefined4 *)0x0) {
    local_4 = 2;
  }
  else {
    iVar1 = strcmp("FMS_FLOAT",in_RDI);
    if (iVar1 == 0) {
      *in_RSI = 0;
    }
    else {
      iVar1 = strcmp("FMS_DOUBLE",in_RDI);
      if (iVar1 == 0) {
        *in_RSI = 1;
      }
      else {
        iVar1 = strcmp("FMS_COMPLEX_FLOAT",in_RDI);
        if (iVar1 == 0) {
          *in_RSI = 2;
        }
        else {
          iVar1 = strcmp("FMS_COMPLEX_DOUBLE",in_RDI);
          if (iVar1 != 0) {
            return 3;
          }
          *in_RSI = 3;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsGetScalarTypeFromName(const char * const name, FmsScalarType *type) {
  if(!name) E_RETURN(1);
  if(!type) E_RETURN(2);

  if(strcmp(FmsScalarTypeNames[FMS_FLOAT], name) == 0)
    *type = FMS_FLOAT;
  else if(strcmp(FmsScalarTypeNames[FMS_DOUBLE], name) == 0)
    *type = FMS_DOUBLE;
  else if(strcmp(FmsScalarTypeNames[FMS_COMPLEX_FLOAT], name) == 0)
    *type = FMS_COMPLEX_FLOAT;
  else if(strcmp(FmsScalarTypeNames[FMS_COMPLEX_DOUBLE], name) == 0)
    *type = FMS_COMPLEX_DOUBLE;
  else
    E_RETURN(3);

  return 0;
}